

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::VariableDatum::VariableDatum(VariableDatum *this,DatumID ID,KString *Value)

{
  KString *Value_local;
  DatumID ID_local;
  VariableDatum *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__VariableDatum_00331018;
  std::
  vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ::vector(&this->m_v8DatumValue);
  this->m_ui32DatumID = ID;
  (*(this->super_DataTypeBase)._vptr_DataTypeBase[0xe])(this,Value);
  return;
}

Assistant:

VariableDatum::VariableDatum( DatumID ID, const KString & Value )
{
    m_ui32DatumID = ID;

    SetDatumValue( Value );
}